

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

gdImagePtr gdImageClone(gdImagePtr src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  gdImagePtr im;
  long lVar6;
  gdImagePtr pgVar7;
  long lVar8;
  
  if (src->trueColor == 0) {
    im = gdImageCreate(src->sx,src->sy);
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (im != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      im->colorsTotal = src->colorsTotal;
      for (lVar6 = 0x614; lVar6 != 0x714; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)im + lVar6 * 4 + -0x183c) =
             *(undefined4 *)((long)src + lVar6 * 4 + -0x183c);
        *(undefined4 *)((long)im + lVar6 * 4 + -0x143c) =
             *(undefined4 *)((long)src + lVar6 * 4 + -0x143c);
        *(undefined4 *)((long)im + lVar6 * 4 + -0x103c) =
             *(undefined4 *)((long)src + lVar6 * 4 + -0x103c);
        im->red[lVar6 + -5] = src->red[lVar6 + -5];
        *(undefined4 *)((long)im + lVar6 * 4 + -0xc3c) =
             *(undefined4 *)((long)src + lVar6 * 4 + -0xc3c);
      }
      for (lVar6 = 0; lVar6 < src->sy; lVar6 = lVar6 + 1) {
        for (lVar8 = 0; lVar8 < src->sx; lVar8 = lVar8 + 1) {
          im->pixels[lVar6][lVar8] = src->pixels[lVar6][lVar8];
        }
      }
    }
    else {
      for (lVar6 = 0; lVar6 < src->sy; lVar6 = lVar6 + 1) {
        for (lVar8 = 0; lVar8 < src->sx; lVar8 = lVar8 + 1) {
          im->tpixels[lVar6][lVar8] = src->tpixels[lVar6][lVar8];
        }
      }
    }
    if (0 < src->styleLength) {
      im->styleLength = src->styleLength;
      im->stylePos = src->stylePos;
      for (lVar6 = 0; lVar6 < src->styleLength; lVar6 = lVar6 + 1) {
        im->style[lVar6] = src->style[lVar6];
      }
    }
    im->interlace = src->interlace;
    iVar1 = src->saveAlphaFlag;
    iVar2 = src->AA;
    iVar3 = src->AA_color;
    im->alphaBlendingFlag = src->alphaBlendingFlag;
    im->saveAlphaFlag = iVar1;
    im->AA = iVar2;
    im->AA_color = iVar3;
    iVar1 = src->cx1;
    iVar2 = src->cy1;
    iVar3 = src->cx2;
    im->AA_dont_blend = src->AA_dont_blend;
    im->cx1 = iVar1;
    im->cy1 = iVar2;
    im->cx2 = iVar3;
    uVar4 = src->res_x;
    uVar5 = src->res_y;
    iVar1 = src->paletteQuantizationMethod;
    im->cy2 = src->cy2;
    im->res_x = uVar4;
    im->res_y = uVar5;
    im->paletteQuantizationMethod = iVar1;
    iVar1 = src->paletteQuantizationMinQuality;
    im->paletteQuantizationSpeed = src->paletteQuantizationSpeed;
    im->paletteQuantizationMinQuality = iVar1;
    im->interpolation_id = src->interpolation_id;
    im->interpolation = src->interpolation;
    if (src->brush != (gdImagePtr)0x0) {
      pgVar7 = gdImageClone(src->brush);
      im->brush = pgVar7;
    }
    if (src->tile != (gdImagePtr)0x0) {
      pgVar7 = gdImageClone(src->tile);
      im->tile = pgVar7;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(im,src->style,src->styleLength);
    }
    for (lVar6 = -0x400; lVar6 != 0; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)im->tileColorMap + lVar6) =
           *(undefined4 *)((long)src->tileColorMap + lVar6);
      *(undefined4 *)((long)im->alpha + lVar6 + -0x18) =
           *(undefined4 *)((long)src->alpha + lVar6 + -0x18);
    }
    if (0 < src->polyAllocated) {
      im->polyAllocated = src->polyAllocated;
      for (lVar6 = 0; lVar6 < src->polyAllocated; lVar6 = lVar6 + 1) {
        im->polyInts[lVar6] = src->polyInts[lVar6];
      }
    }
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = src->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_y;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}